

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O0

void rotateImage(Mat *input,Mat *output,double alpha,double beta,double gamma,double dx,double dy,
                double dz,double f)

{
  int iVar1;
  int iVar2;
  MatCommaInitializer_<double> *pMVar3;
  MatCommaInitializer_ *pMVar4;
  double dVar5;
  double __x;
  double __x_00;
  double dVar6;
  Scalar_<double> local_10e0;
  MatSize local_10c0 [8];
  _InputArray local_10b8;
  _OutputArray local_10a0;
  _InputArray local_1088;
  Scalar_<double> local_1070;
  _OutputArray local_1050;
  _InputArray local_1038;
  Mat local_1020 [8];
  Mat bordered;
  Mat local_fc0 [352];
  Mat local_e60 [352];
  Mat local_d00 [352];
  MatExpr local_ba0 [8];
  Mat trans;
  Mat_<double> local_b40;
  MatCommaInitializer_<double> local_ae0;
  Mat_<double> local_ab8;
  Mat local_a58 [8];
  Mat A2;
  Mat_<double> local_9f8;
  MatCommaInitializer_<double> local_998;
  Mat_<double> local_970;
  Mat local_910 [8];
  Mat T;
  Mat local_8b0 [352];
  MatExpr local_750 [352];
  MatExpr local_5f0 [8];
  Mat R;
  Mat_<double> local_590;
  MatCommaInitializer_<double> local_530;
  Mat_<double> local_508;
  Mat local_4a8 [8];
  Mat RZ;
  Mat_<double> local_448;
  MatCommaInitializer_<double> local_3e8;
  Mat_<double> local_3c0;
  Mat local_360 [8];
  Mat RY;
  Mat_<double> local_300;
  MatCommaInitializer_<double> local_2a0;
  Mat_<double> local_278;
  Mat local_218 [8];
  Mat RX;
  Mat_<double> local_1a8;
  MatCommaInitializer_<double> local_148;
  Mat_<double> local_120;
  Mat local_c0 [8];
  Mat A1;
  double h;
  double w;
  double f_local;
  double dz_local;
  double dy_local;
  double dx_local;
  double gamma_local;
  double beta_local;
  double alpha_local;
  Mat *output_local;
  Mat *input_local;
  
  dVar5 = (alpha * 3.141592653589793) / 180.0;
  __x = (beta * 3.141592653589793) / 180.0;
  __x_00 = (gamma * 3.141592653589793) / 180.0;
  iVar1 = *(int *)(input + 0xc);
  iVar2 = *(int *)(input + 8);
  cv::Mat_<double>::Mat_(&local_1a8,4,3);
  cv::operator<<(&local_148,&local_1a8,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(&local_148,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar1 * -0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar2 * -0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_120,pMVar4);
  cv::Mat::Mat(local_c0,&local_120.super_Mat);
  cv::Mat_<double>::~Mat_(&local_120);
  cv::Mat_<double>::~Mat_(&local_1a8);
  cv::Mat_<double>::Mat_(&local_300,4,4);
  cv::operator<<(&local_2a0,&local_300,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(&local_2a0,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar6 = cos(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar6);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,-dVar6);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar6);
  dVar5 = cos(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_278,pMVar4);
  cv::Mat::Mat(local_218,&local_278.super_Mat);
  cv::Mat_<double>::~Mat_(&local_278);
  cv::Mat_<double>::~Mat_(&local_300);
  cv::Mat_<double>::Mat_(&local_448,4,4);
  dVar5 = cos(__x);
  cv::operator<<(&local_3e8,&local_448,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(&local_3e8,0);
  dVar5 = sin(__x);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,-dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar5 = sin(__x);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar5 = cos(__x);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_3c0,pMVar4);
  cv::Mat::Mat(local_360,&local_3c0.super_Mat);
  cv::Mat_<double>::~Mat_(&local_3c0);
  cv::Mat_<double>::~Mat_(&local_448);
  cv::Mat_<double>::Mat_(&local_590,4,4);
  dVar5 = cos(__x_00);
  cv::operator<<(&local_530,&local_590,dVar5);
  dVar5 = sin(__x_00);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(&local_530,-dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar5 = sin(__x_00);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  dVar5 = cos(__x_00);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_508,pMVar4);
  cv::Mat::Mat(local_4a8,&local_508.super_Mat);
  cv::Mat_<double>::~Mat_(&local_508);
  cv::Mat_<double>::~Mat_(&local_590);
  cv::operator*(local_8b0,local_218);
  cv::operator*(local_750,local_8b0);
  cv::MatExpr::operator_cast_to_Mat(local_5f0);
  cv::MatExpr::~MatExpr(local_750);
  cv::MatExpr::~MatExpr((MatExpr *)local_8b0);
  cv::Mat_<double>::Mat_(&local_9f8,4,4);
  cv::operator<<(&local_998,&local_9f8,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(&local_998,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dx);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dy);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dz);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_970,pMVar4);
  cv::Mat::Mat(local_910,&local_970.super_Mat);
  cv::Mat_<double>::~Mat_(&local_970);
  cv::Mat_<double>::~Mat_(&local_9f8);
  cv::Mat_<double>::Mat_(&local_b40,3,4);
  cv::operator<<(&local_ae0,&local_b40,f);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(&local_ae0,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar1 * 0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,f);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar2 * 0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_ab8,pMVar4);
  cv::Mat::Mat(local_a58,&local_ab8.super_Mat);
  cv::Mat_<double>::~Mat_(&local_ab8);
  cv::Mat_<double>::~Mat_(&local_b40);
  cv::operator*(local_fc0,(Mat *)local_5f0);
  cv::operator*(local_e60,(MatExpr *)local_910);
  cv::operator*(local_d00,(MatExpr *)local_a58);
  cv::MatExpr::operator_cast_to_Mat(local_ba0);
  cv::MatExpr::~MatExpr((MatExpr *)local_d00);
  cv::MatExpr::~MatExpr((MatExpr *)local_e60);
  cv::MatExpr::~MatExpr((MatExpr *)local_fc0);
  cv::Mat::Mat(local_1020);
  cv::_InputArray::_InputArray(&local_1038,input);
  cv::_OutputArray::_OutputArray(&local_1050,local_1020);
  iVar1 = *(int *)(input + 8);
  iVar2 = *(int *)(input + 0xc);
  cv::Scalar_<double>::Scalar_(&local_1070,0.0,0.0,0.0,0.0);
  cv::copyMakeBorder(&local_1038,&local_1050,iVar1,iVar1,(int)((double)iVar2 * 0.3),
                     (int)((double)iVar2 * 0.3),0,(Scalar_ *)&local_1070);
  cv::_OutputArray::~_OutputArray(&local_1050);
  cv::_InputArray::~_InputArray(&local_1038);
  cv::_InputArray::_InputArray(&local_1088,local_1020);
  cv::_OutputArray::_OutputArray(&local_10a0,output);
  cv::_InputArray::_InputArray(&local_10b8,(Mat *)local_ba0);
  cv::MatSize::operator()(local_10c0);
  cv::Scalar_<double>::Scalar_(&local_10e0);
  cv::warpPerspective(&local_1088,&local_10a0,&local_10b8,local_10c0,4,0,&local_10e0);
  cv::_InputArray::~_InputArray(&local_10b8);
  cv::_OutputArray::~_OutputArray(&local_10a0);
  cv::_InputArray::~_InputArray(&local_1088);
  cv::Mat::~Mat(local_1020);
  cv::Mat::~Mat((Mat *)local_ba0);
  cv::Mat::~Mat(local_a58);
  cv::Mat::~Mat(local_910);
  cv::Mat::~Mat((Mat *)local_5f0);
  cv::Mat::~Mat(local_4a8);
  cv::Mat::~Mat(local_360);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat(local_c0);
  return;
}

Assistant:

void rotateImage(const cv::Mat &input,cv::Mat &output, double alpha, double beta, double gamma, double dx, double dy, double dz, double f) {
    alpha = (alpha)*CV_PI/180.;
    beta = (beta)*CV_PI/180.;
    gamma = (gamma)*CV_PI/180.;
    // get width and height for ease of use in cv::Matrices
    double w = (double)input.cols;
    double h = (double)input.rows;
    // Projection 2D -> 3D cv::Matrix
    cv::Mat A1 = (cv::Mat_<double>(4,3) <<
              1, 0, -w/2.,
              0, 1, -h/2.,
              0, 0, 0,
              0, 0, 1);
    // Rotation cv::Matrices around the X, Y, and Z axis
    cv::Mat RX = (cv::Mat_<double>(4, 4) <<
              1,          0,           0, 0,
              0, cos(alpha), -sin(alpha), 0,
              0, sin(alpha),  cos(alpha), 0,
              0,          0,           0, 1);
    cv::Mat RY = (cv::Mat_<double>(4, 4) <<
              cos(beta), 0, -sin(beta), 0,
              0, 1,          0, 0,
              sin(beta), 0,  cos(beta), 0,
              0, 0,          0, 1);
    cv::Mat RZ = (cv::Mat_<double>(4, 4) <<
              cos(gamma), -sin(gamma), 0, 0,
              sin(gamma),  cos(gamma), 0, 0,
              0,          0,           1, 0,
              0,          0,           0, 1);
    // Composed rotation cv::Matrix with (RX, RY, RZ)
    cv::Mat R = RX * RY * RZ;
    // Translation cv::Matrix
    cv::Mat T = (cv::Mat_<double>(4, 4) <<
             1, 0, 0, dx,
             0, 1, 0, dy,
             0, 0, 1, dz,
             0, 0, 0, 1);
    // 3D -> 2D cv::Matrix
    cv::Mat A2 = (cv::Mat_<double>(3,4) <<
              f, 0, w/2, 0,
              0, f, h/2, 0,
              0, 0,   1, 0);
    // Final transforcv::Mation cv::Matrix
    cv::Mat trans = A2 * (T * (R * A1));
    // Apply cv::Matrix transforcv::Mation
    cv::Mat bordered;
    cv::copyMakeBorder(input, bordered, input.rows, input.rows, input.cols*.3, input.cols*.3, cv::BORDER_CONSTANT, cv::Scalar(0,0,0));
    cv::warpPerspective(bordered, output, trans, bordered.size(), cv::INTER_LANCZOS4);
}